

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineQueryResultLocation.h
# Opt level: O0

void __thiscall
TgBot::InlineQueryResultLocation::InlineQueryResultLocation(InlineQueryResultLocation *this)

{
  InlineQueryResultLocation *this_local;
  
  InlineQueryResult::InlineQueryResult(&this->super_InlineQueryResult);
  (this->super_InlineQueryResult)._vptr_InlineQueryResult =
       (_func_int **)&PTR__InlineQueryResultLocation_0051b288;
  std::__cxx11::string::string((string *)&this->thumbUrl);
  std::__cxx11::string::operator=
            ((string *)&(this->super_InlineQueryResult).type,(string *)&TYPE_abi_cxx11_);
  this->thumbHeight = 0;
  this->thumbWidth = 0;
  return;
}

Assistant:

InlineQueryResultLocation() {
        this->type = TYPE;
        this->thumbHeight = 0;
        this->thumbWidth = 0;
    }